

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stopwatch.h
# Opt level: O0

double StopwatchReadAndReset(Stopwatch *watch)

{
  long lVar1;
  long lVar2;
  timeval *in_RDI;
  double delta_usec;
  double delta_sec;
  timeval old_value;
  
  lVar1 = in_RDI->tv_sec;
  lVar2 = in_RDI->tv_usec;
  gettimeofday(in_RDI,(__timezone_ptr_t)0x0);
  return ((double)in_RDI->tv_sec - (double)lVar1) +
         ((double)in_RDI->tv_usec - (double)lVar2) / 1000000.0;
}

Assistant:

static WEBP_INLINE double StopwatchReadAndReset(Stopwatch* watch) {
  struct timeval old_value;
  double delta_sec, delta_usec;
  memcpy(&old_value, watch, sizeof(old_value));
  gettimeofday(watch, NULL);
  delta_sec = (double)watch->tv_sec - old_value.tv_sec;
  delta_usec = (double)watch->tv_usec - old_value.tv_usec;
  return delta_sec + delta_usec / 1000000.0;
}